

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool absl::lts_20250127::debugging_internal::ParseType(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  ComplexityGuard guard;
  char *pcVar13;
  long lVar14;
  undefined **ppuVar15;
  ParseState copy;
  int number;
  undefined4 uStack_44;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar11 = state->recursion_depth;
  iVar12 = state->steps;
  state->recursion_depth = iVar11 + 1;
  state->steps = iVar12 + 1;
  if (0x1ffff < iVar12 || 0xff < iVar11) {
    bVar9 = false;
    goto LAB_00283459;
  }
  uVar5 = (state->parse_state).mangled_idx;
  uVar6 = (state->parse_state).out_cur_idx;
  uVar7 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  bVar9 = ParseCVQualifiers(state);
  pPVar1 = &state->parse_state;
  if (bVar9) {
    bVar10 = ParseType(state);
LAB_00283443:
    bVar9 = true;
    if (bVar10 == false) {
      pPVar1->mangled_idx = uVar5;
      pPVar1->out_cur_idx = uVar6;
      *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
      bVar9 = false;
    }
  }
  else {
    pPVar1->mangled_idx = uVar5;
    pPVar1->out_cur_idx = uVar6;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
    bVar9 = ParseCharClass(state,"OPRCG");
    if (bVar9) {
      bVar10 = ParseType(state);
      goto LAB_00283443;
    }
    pPVar1->mangled_idx = uVar5;
    pPVar1->out_cur_idx = uVar6;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
    bVar9 = ParseTwoCharToken(state,"Dp");
    if (bVar9) {
      bVar10 = ParseType(state);
      bVar9 = true;
      if (!bVar10) goto LAB_00283493;
    }
    else {
LAB_00283493:
      pPVar1->mangled_idx = uVar5;
      pPVar1->out_cur_idx = uVar6;
      *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
      iVar12 = state->recursion_depth;
      iVar2 = state->steps;
      iVar11 = iVar12 + 1;
      state->recursion_depth = iVar11;
      state->steps = iVar2 + 1;
      if (iVar2 < 0x20000 && iVar12 < 0x100) {
        bVar9 = ParseTwoCharToken(state,"DB");
        if (!bVar9) {
          bVar9 = ParseTwoCharToken(state,"DU");
          if (bVar9) {
            MaybeAppend(state,"unsigned ");
            goto LAB_00283501;
          }
          bVar9 = ParseTwoCharToken(state,"DF");
          if (bVar9) {
            bVar9 = ParseThreeCharToken(state,"16b");
            if (bVar9) {
              pcVar13 = "std::bfloat16_t";
              goto LAB_00283604;
            }
            _number = _number & 0xffffffff00000000;
            bVar9 = ParseNumber(state,&number);
            if (!bVar9) goto LAB_00283694;
            MaybeAppend(state,"_Float");
            MaybeAppendDecimal(state,number);
            bVar9 = ParseOneCharToken(state,'x');
            if (bVar9) {
              pcVar13 = "x";
              goto LAB_00283604;
            }
            bVar9 = ParseOneCharToken(state,'_');
            if (!bVar9) goto LAB_00283694;
            goto LAB_0028360c;
          }
          for (ppuVar15 = &PTR_anon_var_dwarf_a4d302_00438318; pcVar13 = ppuVar15[-1],
              pcVar13 != (char *)0x0; ppuVar15 = ppuVar15 + 3) {
            if (pcVar13[1] == '\0') {
              bVar9 = ParseOneCharToken(state,*pcVar13);
LAB_002835e0:
              if (bVar9 != false) {
                pcVar13 = *ppuVar15;
                goto LAB_00283604;
              }
            }
            else if (pcVar13[2] == '\0') {
              bVar9 = ParseTwoCharToken(state,pcVar13);
              goto LAB_002835e0;
            }
          }
          bVar10 = ParseVendorExtendedType(state);
          iVar11 = state->recursion_depth;
          state->recursion_depth = iVar11 + -1;
          bVar9 = true;
          if (bVar10) goto LAB_00283454;
          goto LAB_002836a5;
        }
LAB_00283501:
        uVar3 = *(uint *)&(state->parse_state).field_0xc;
        *(uint *)&(state->parse_state).field_0xc = uVar3 & 0x7fffffff;
        _number = CONCAT44(uStack_44,0xffffffff);
        bVar9 = ParseNumber(state,&number);
        if ((!bVar9) && (bVar9 = ParseExpression(state), !bVar9)) {
LAB_00283694:
          pPVar1->mangled_idx = uVar5;
          pPVar1->out_cur_idx = uVar6;
          *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
          iVar11 = state->recursion_depth;
          iVar12 = iVar11 + -1;
          goto LAB_002836a2;
        }
        *(uint *)&(state->parse_state).field_0xc =
             *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar3 & 0x80000000;
        bVar9 = ParseOneCharToken(state,'_');
        if (!bVar9) goto LAB_00283694;
        MaybeAppend(state,"_BitInt(");
        if (number < 0) {
          MaybeAppend(state,"?");
        }
        else {
          MaybeAppendDecimal(state,number);
        }
        pcVar13 = ")";
LAB_00283604:
        MaybeAppend(state,pcVar13);
LAB_0028360c:
        state->recursion_depth = state->recursion_depth + -1;
        bVar9 = true;
      }
      else {
LAB_002836a2:
        state->recursion_depth = iVar12;
LAB_002836a5:
        state->recursion_depth = iVar11;
        iVar12 = state->steps;
        state->steps = iVar12 + 1;
        if (iVar12 < 0x20000 && iVar11 < 0x101) {
          local_38._0_4_ = pPVar1->mangled_idx;
          local_38._4_4_ = pPVar1->out_cur_idx;
          uStack_30 = *(undefined8 *)&(state->parse_state).prev_name_idx;
          state->recursion_depth = iVar11 + 1;
          state->steps = iVar12 + 2;
          if ((iVar12 < 0x1ffff && iVar11 < 0x100) &&
             (bVar9 = ParseTwoCharToken(state,"Do"), !bVar9)) {
            number = pPVar1->mangled_idx;
            uStack_44 = pPVar1->out_cur_idx;
            uStack_40 = *(undefined8 *)&(state->parse_state).prev_name_idx;
            bVar9 = ParseTwoCharToken(state,"DO");
            if ((!bVar9) ||
               ((bVar9 = ParseExpression(state), !bVar9 ||
                (bVar9 = ParseOneCharToken(state,'E'), !bVar9)))) {
              pPVar1->mangled_idx = number;
              pPVar1->out_cur_idx = uStack_44;
              *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_40;
              bVar9 = ParseTwoCharToken(state,"Dw");
              if ((!bVar9) ||
                 ((bVar9 = OneOrMore(ParseType,state), !bVar9 ||
                  (bVar9 = ParseOneCharToken(state,'E'), !bVar9)))) {
                pPVar1->mangled_idx = number;
                pPVar1->out_cur_idx = uStack_44;
                *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_40;
              }
            }
          }
          state->recursion_depth = state->recursion_depth + -1;
          ParseTwoCharToken(state,"Dx");
          bVar9 = ParseOneCharToken(state,'F');
          if (bVar9) {
            ParseOneCharToken(state,'Y');
            bVar9 = ParseBareFunctionType(state);
            if (bVar9) {
              ParseCharClass(state,"RO");
              bVar9 = ParseOneCharToken(state,'E');
              if (bVar9) goto LAB_0028360c;
            }
          }
          pPVar1->mangled_idx = (undefined4)local_38;
          pPVar1->out_cur_idx = local_38._4_4_;
          *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_30;
          iVar11 = state->recursion_depth;
        }
        state->recursion_depth = iVar11 + -1;
        bVar10 = ParseClassEnumType(state);
        bVar9 = true;
        if (!bVar10) {
          iVar2 = state->recursion_depth;
          iVar4 = state->steps;
          iVar11 = iVar2 + 1;
          state->recursion_depth = iVar11;
          iVar12 = iVar4 + 1;
          state->steps = iVar12;
          if (iVar4 < 0x20000 && iVar2 < 0x100) {
            number = pPVar1->mangled_idx;
            uStack_44 = pPVar1->out_cur_idx;
            uStack_40 = *(undefined8 *)&(state->parse_state).prev_name_idx;
            bVar10 = ParseOneCharToken(state,'A');
            if ((((!bVar10) || (bVar10 = ParseNumber(state,(int *)0x0), !bVar10)) ||
                (bVar10 = ParseOneCharToken(state,'_'), !bVar10)) ||
               (bVar10 = ParseType(state), !bVar10)) {
              pPVar1->mangled_idx = number;
              pPVar1->out_cur_idx = uStack_44;
              *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_40;
              bVar10 = ParseOneCharToken(state,'A');
              if (bVar10) {
                ParseExpression(state);
                bVar10 = ParseOneCharToken(state,'_');
                if ((bVar10) && (bVar10 = ParseType(state), bVar10)) goto LAB_00283911;
              }
              pPVar1->mangled_idx = number;
              pPVar1->out_cur_idx = uStack_44;
              *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_40;
              iVar11 = state->recursion_depth;
              iVar12 = state->steps;
              goto LAB_002838c6;
            }
LAB_00283911:
            state->recursion_depth = state->recursion_depth + -1;
          }
          else {
LAB_002838c6:
            state->steps = iVar12 + 1;
            if (iVar12 < 0x20000 && iVar11 < 0x101) {
              number = pPVar1->mangled_idx;
              uStack_44 = pPVar1->out_cur_idx;
              uStack_40 = *(undefined8 *)&(state->parse_state).prev_name_idx;
              bVar10 = ParseOneCharToken(state,'M');
              if (((bVar10) && (bVar10 = ParseType(state), bVar10)) &&
                 (bVar10 = ParseType(state), bVar10)) goto LAB_00283911;
              pPVar1->mangled_idx = number;
              pPVar1->out_cur_idx = uStack_44;
              *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_40;
              iVar11 = state->recursion_depth;
            }
            state->recursion_depth = iVar11 + -1;
            bVar10 = ParseDecltype(state);
            if ((!bVar10) && (bVar10 = ParseSubstitution(state,false), !bVar10)) {
              iVar11 = state->recursion_depth;
              iVar12 = state->steps;
              state->recursion_depth = iVar11 + 1;
              state->steps = iVar12 + 1;
              if (iVar12 < 0x20000 && iVar11 < 0x100) {
                bVar10 = ParseTemplateParam(state);
                if (bVar10) {
                  state->recursion_depth = state->recursion_depth + -1;
                }
                else {
                  bVar10 = ParseSubstitution(state,false);
                  state->recursion_depth = state->recursion_depth + -1;
                  if (!bVar10) goto LAB_002839ad;
                }
                bVar10 = ParseTemplateArgs(state);
                if (bVar10) goto LAB_00283454;
              }
              else {
                state->recursion_depth = iVar11;
              }
LAB_002839ad:
              pPVar1->mangled_idx = uVar5;
              pPVar1->out_cur_idx = uVar6;
              *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
              bVar10 = ParseTemplateParam(state);
              if ((!bVar10) &&
                 ((((bVar10 = ParseTwoCharToken(state,"Dv"), !bVar10 ||
                    (bVar10 = ParseNumber(state,(int *)0x0), !bVar10)) ||
                   (bVar10 = ParseOneCharToken(state,'_'), !bVar10)) ||
                  (bVar10 = ParseType(state), !bVar10)))) {
                pPVar1->mangled_idx = uVar5;
                pPVar1->out_cur_idx = uVar6;
                *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
                bVar10 = ParseTwoCharToken(state,"Dv");
                if (((!bVar10) || (bVar10 = ParseExpression(state), !bVar10)) ||
                   ((bVar10 = ParseOneCharToken(state,'_'), !bVar10 ||
                    (bVar10 = ParseType(state), !bVar10)))) {
                  pPVar1->mangled_idx = uVar5;
                  pPVar1->out_cur_idx = uVar6;
                  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
                  bVar10 = ParseTwoCharToken(state,"Dk");
                  if ((!bVar10) || (bVar10 = ParseName(state), !bVar10)) {
                    pPVar1->mangled_idx = uVar5;
                    pPVar1->out_cur_idx = uVar6;
                    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar7;
                    iVar11 = state->recursion_depth;
                    iVar12 = state->steps;
                    state->recursion_depth = iVar11 + 1;
                    state->steps = iVar12 + 1;
                    if (iVar12 < 0x20000 && iVar11 < 0x100) {
                      iVar12 = (state->parse_state).mangled_idx;
                      lVar14 = 0;
                      do {
                        if (lVar14 == 0xb) {
                          pPVar1->mangled_idx = iVar12 + 0xb;
                          bVar9 = true;
                          goto LAB_00283adc;
                        }
                        lVar8 = lVar14 + iVar12;
                        pcVar13 = "_SUBSTPACK_" + lVar14;
                        lVar14 = lVar14 + 1;
                      } while (state->mangled_begin[lVar8] == *pcVar13);
                    }
                    bVar9 = false;
LAB_00283adc:
                    state->recursion_depth = iVar11;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00283454:
  iVar11 = state->recursion_depth + -1;
LAB_00283459:
  state->recursion_depth = iVar11;
  return bVar9;
}

Assistant:

static bool ParseType(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  // We should check CV-qualifers, and PRGC things first.
  //
  // CV-qualifiers overlap with some operator names, but an operator name is not
  // valid as a type.  To avoid an ambiguity that can lead to exponential time
  // complexity, refuse to backtrack the CV-qualifiers.
  //
  // _Z4aoeuIrMvvE
  //  => _Z 4aoeuI        rM  v     v   E
  //         aoeu<operator%=, void, void>
  //  => _Z 4aoeuI r Mv v              E
  //         aoeu<void void::* restrict>
  //
  // By consuming the CV-qualifiers first, the former parse is disabled.
  if (ParseCVQualifiers(state)) {
    const bool result = ParseType(state);
    if (!result) state->parse_state = copy;
    return result;
  }
  state->parse_state = copy;

  // Similarly, these tag characters can overlap with other <name>s resulting in
  // two different parse prefixes that land on <template-args> in the same
  // place, such as "C3r1xI...".  So, disable the "ctor-name = C3" parse by
  // refusing to backtrack the tag characters.
  if (ParseCharClass(state, "OPRCG")) {
    const bool result = ParseType(state);
    if (!result) state->parse_state = copy;
    return result;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Dp") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseBuiltinType(state) || ParseFunctionType(state) ||
      ParseClassEnumType(state) || ParseArrayType(state) ||
      ParsePointerToMemberType(state) || ParseDecltype(state) ||
      // "std" on its own isn't a type.
      ParseSubstitution(state, /*accept_std=*/false)) {
    return true;
  }

  if (ParseTemplateTemplateParam(state) && ParseTemplateArgs(state)) {
    return true;
  }
  state->parse_state = copy;

  // Less greedy than <template-template-param> <template-args>.
  if (ParseTemplateParam(state)) {
    return true;
  }

  // GNU vector extension Dv <number> _ <type>
  if (ParseTwoCharToken(state, "Dv") && ParseNumber(state, nullptr) &&
      ParseOneCharToken(state, '_') && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // GNU vector extension Dv <expression> _ <type>
  if (ParseTwoCharToken(state, "Dv") && ParseExpression(state) &&
      ParseOneCharToken(state, '_') && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Dk") && ParseTypeConstraint(state)) {
    return true;
  }
  state->parse_state = copy;

  // For this notation see CXXNameMangler::mangleType in Clang's source code.
  // The relevant logic and its comment "not clear how to mangle this!" date
  // from 2011, so it may be with us awhile.
  return ParseLongToken(state, "_SUBSTPACK_");
}